

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout.cpp
# Opt level: O0

int __thiscall ncnn::Dropout::forward_inplace(Dropout *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *in_RSI;
  long lVar4;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *m;
  int local_160;
  int local_fc;
  
  if ((*(float *)(in_RDI + 0xd0) != 1.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar2 = in_RSI[6];
    lVar3 = in_RSI[7];
    for (local_fc = 0; local_fc < (int)lVar3; local_fc = local_fc + 1) {
      lVar4 = *in_RSI + in_RSI[8] * (long)local_fc * in_RSI[2];
      for (local_160 = 0; local_160 < iVar1 * (int)lVar2; local_160 = local_160 + 1) {
        *(float *)(lVar4 + (long)local_160 * 4) =
             *(float *)(lVar4 + (long)local_160 * 4) * *(float *)(in_RDI + 0xd0);
      }
    }
  }
  return 0;
}

Assistant:

int Dropout::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * scale;
        }
    }

    return 0;
}